

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void wabt::WriteOpcode(Stream *stream,Opcode opcode)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  char *pcVar4;
  Opcode local_1c;
  
  local_1c.enum_ = opcode.enum_;
  bVar1 = Opcode::HasPrefix(&local_1c);
  if (bVar1) {
    bVar2 = Opcode::GetPrefix(&local_1c);
    Stream::WriteU8(stream,(uint)bVar2,"prefix",No);
    uVar3 = Opcode::GetCode(&local_1c);
    pcVar4 = Opcode::GetName(&local_1c);
    WriteU32Leb128(stream,uVar3,pcVar4);
  }
  else {
    uVar3 = Opcode::GetCode(&local_1c);
    pcVar4 = Opcode::GetName(&local_1c);
    Stream::WriteU8(stream,uVar3,pcVar4,No);
  }
  return;
}

Assistant:

void WriteOpcode(Stream* stream, Opcode opcode) {
  if (opcode.HasPrefix()) {
    stream->WriteU8(opcode.GetPrefix(), "prefix");
    WriteU32Leb128(stream, opcode.GetCode(), opcode.GetName());
  } else {
    stream->WriteU8(opcode.GetCode(), opcode.GetName());
  }
}